

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

shared_ptr<polyscope::render::AttributeBuffer> __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getRenderAttributeBuffer
          (ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Engine *in_RDI;
  shared_ptr<polyscope::render::AttributeBuffer> sVar3;
  DeviceBufferType in_stack_0000008c;
  ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *in_stack_00000090;
  Engine *this_00;
  
  this_00 = in_RDI;
  checkDeviceBufferTypeIs(in_stack_00000090,in_stack_0000008c);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x70));
  if (!bVar1) {
    ensureHostBufferPopulated(in_stack_00000090);
    generateAttributeBuffer<glm::vec<2,float,(glm::qualifier)0>>(in_RDI);
    std::shared_ptr<polyscope::render::AttributeBuffer>::operator=
              ((shared_ptr<polyscope::render::AttributeBuffer> *)this_00,
               (shared_ptr<polyscope::render::AttributeBuffer> *)in_RDI);
    std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
              ((shared_ptr<polyscope::render::AttributeBuffer> *)0x413db8);
    peVar2 = std::
             __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x413dc6);
    (*peVar2->_vptr_AttributeBuffer[2])(peVar2,*(undefined8 *)(in_RSI + 0x38));
  }
  std::shared_ptr<polyscope::render::AttributeBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)this_00,
             (shared_ptr<polyscope::render::AttributeBuffer> *)in_RDI);
  sVar3.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  return (shared_ptr<polyscope::render::AttributeBuffer>)
         sVar3.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<render::AttributeBuffer> ManagedBuffer<T>::getRenderAttributeBuffer() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  if (!renderAttributeBuffer) {
    ensureHostBufferPopulated(); // warning: the order of these matters because of how hostBufferPopulated works
    renderAttributeBuffer = generateAttributeBuffer<T>(render::engine);
    renderAttributeBuffer->setData(data);
  }
  return renderAttributeBuffer;
}